

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRamp::IfcRamp(IfcRamp *this)

{
  *(undefined ***)&this->field_0x178 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x180 = 0;
  *(char **)&this->field_0x188 = "IfcRamp";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__0086bd80);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x86bc50;
  *(undefined8 *)&this->field_0x178 = 0x86bd68;
  *(undefined8 *)&this->field_0x88 = 0x86bc78;
  *(undefined8 *)&this->field_0x98 = 0x86bca0;
  *(undefined8 *)&this->field_0xd0 = 0x86bcc8;
  *(undefined8 *)&this->field_0x100 = 0x86bcf0;
  *(undefined8 *)&this->field_0x138 = 0x86bd18;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x86bd40;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcRamp() : Object("IfcRamp") {}